

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Printer.h
# Opt level: O0

void __thiscall soul::heart::Printer::PrinterStream::printStruct(PrinterStream *this,Structure *s)

{
  CodePrinter *pCVar1;
  string *s_00;
  int *piVar2;
  string local_e8;
  string local_c8;
  Member *local_a8;
  Member *m_1;
  Member *__end3;
  Member *__begin3;
  ArrayWithPreallocation<soul::Structure::Member,_8UL> *local_80;
  ArrayWithPreallocation<soul::Structure::Member,_8UL> *__range3;
  Indent indent;
  int local_44;
  undefined1 local_40 [8];
  Member *m;
  Member *__end2;
  Member *__begin2;
  ArrayWithPreallocation<soul::Structure::Member,_8UL> *__range2;
  undefined8 uStack_18;
  int maxTypeLen;
  Structure *s_local;
  PrinterStream *this_local;
  
  uStack_18 = s;
  s_local = (Structure *)this;
  pCVar1 = choc::text::CodePrinter::operator<<(this->out,"struct ");
  s_00 = Structure::getName_abi_cxx11_((Structure *)uStack_18);
  pCVar1 = choc::text::CodePrinter::operator<<(pCVar1,s_00);
  choc::text::CodePrinter::operator<<(pCVar1,(NewLine *)&newLine);
  __range2._4_4_ = 0;
  __begin2 = (Member *)Structure::getMembers((Structure *)uStack_18);
  __end2 = ArrayWithPreallocation<soul::Structure::Member,_8UL>::begin
                     ((ArrayWithPreallocation<soul::Structure::Member,_8UL> *)__begin2);
  m = ArrayWithPreallocation<soul::Structure::Member,_8UL>::end
                ((ArrayWithPreallocation<soul::Structure::Member,_8UL> *)__begin2);
  for (; __end2 != m; __end2 = __end2 + 1) {
    local_40 = (undefined1  [8])__end2;
    getTypeDescription_abi_cxx11_((string *)&indent.amount,this,&__end2->type);
    local_44 = std::__cxx11::string::length();
    piVar2 = std::max<int>((int *)((long)&__range2 + 4),&local_44);
    __range2._4_4_ = *piVar2;
    std::__cxx11::string::~string((string *)&indent.amount);
  }
  choc::text::CodePrinter::createIndentWithBraces((CodePrinter *)&__range3,(size_t)this->out);
  local_80 = Structure::getMembers((Structure *)uStack_18);
  __end3 = ArrayWithPreallocation<soul::Structure::Member,_8UL>::begin(local_80);
  m_1 = ArrayWithPreallocation<soul::Structure::Member,_8UL>::end(local_80);
  for (; __end3 != m_1; __end3 = __end3 + 1) {
    local_a8 = __end3;
    pCVar1 = this->out;
    getTypeDescription_abi_cxx11_(&local_e8,this,&__end3->type);
    padded(&local_c8,&local_e8,__range2._4_4_ + 2);
    pCVar1 = choc::text::CodePrinter::operator<<(pCVar1,&local_c8);
    pCVar1 = choc::text::CodePrinter::operator<<(pCVar1,&local_a8->name);
    pCVar1 = choc::text::CodePrinter::operator<<(pCVar1,';');
    choc::text::CodePrinter::operator<<(pCVar1,(NewLine *)&newLine);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::~string((string *)&local_e8);
  }
  choc::text::CodePrinter::Indent::~Indent((Indent *)&__range3);
  choc::text::CodePrinter::operator<<(this->out,(BlankLine *)&blankLine);
  return;
}

Assistant:

void printStruct (const Structure& s) const
        {
            out << "struct " << s.getName() << newLine;

            int maxTypeLen = 0;

            for (auto& m : s.getMembers())
                maxTypeLen = std::max (maxTypeLen, (int) getTypeDescription (m.type).length());

            {
                auto indent = out.createIndentWithBraces (2);

                for (auto& m : s.getMembers())
                    out << padded (getTypeDescription (m.type), maxTypeLen + 2) << m.name << ';' << newLine;
            }

            out << blankLine;
        }